

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

RTMatrix4x4 * __thiscall
RTMatrix4x4::operator*(RTMatrix4x4 *__return_storage_ptr__,RTMatrix4x4 *this,RTMatrix4x4 *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int row;
  long lVar5;
  RTFLOAT (*paRVar6) [4];
  long lVar7;
  
  RTMatrix4x4(__return_storage_ptr__);
  paRVar6 = (RTFLOAT (*) [4])__return_storage_ptr__;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    fVar1 = this->m_data[lVar5][0];
    fVar2 = this->m_data[lVar5][1];
    fVar3 = this->m_data[lVar5][2];
    fVar4 = this->m_data[lVar5][3];
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      (*(RTFLOAT (*) [4])*paRVar6)[lVar7] =
           mat->m_data[3][lVar7] * fVar4 +
           mat->m_data[2][lVar7] * fVar3 +
           mat->m_data[0][lVar7] * fVar1 + mat->m_data[1][lVar7] * fVar2;
    }
    paRVar6 = paRVar6 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const RTMatrix4x4 RTMatrix4x4::operator *(const RTMatrix4x4& mat) const
{
    RTMatrix4x4 res;

    for (int row = 0; row < 4; row++)
        for (int col = 0; col < 4; col++)
            res.m_data[row][col] =
                    m_data[row][0] * mat.m_data[0][col] +
                    m_data[row][1] * mat.m_data[1][col] +
                    m_data[row][2] * mat.m_data[2][col] +
                    m_data[row][3] * mat.m_data[3][col];

    return res;
}